

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  XMLNode *pXVar5;
  undefined **ppuVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  
  bVar1 = *p;
  pcVar9 = p;
  while ((-1 < (char)bVar1 && (iVar4 = isspace((uint)bVar1), iVar4 != 0))) {
    bVar1 = pcVar9[1];
    pcVar9 = pcVar9 + 1;
  }
  cVar2 = *pcVar9;
  if (cVar2 == '\0') {
    pXVar5 = (XMLNode *)0x0;
    goto LAB_001bb3d3;
  }
  pcVar7 = "<?";
  if (pcVar9 == "<?") {
LAB_001bb38d:
    pXVar5 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
    pXVar5->_document = this;
    pXVar5->_parent = (XMLNode *)0x0;
    (pXVar5->_value)._flags = 0;
    (pXVar5->_value)._start = (char *)0x0;
    (pXVar5->_value)._end = (char *)0x0;
    pXVar5->_firstChild = (XMLNode *)0x0;
    pXVar5->_lastChild = (XMLNode *)0x0;
    pXVar5->_prev = (XMLNode *)0x0;
    pXVar5->_next = (XMLNode *)0x0;
    ppuVar6 = &PTR_ToElement_00272680;
  }
  else {
    if (cVar2 == '<') {
      lVar3 = 0;
      do {
        lVar8 = lVar3;
        bVar10 = pcVar9[lVar8 + 1] == '\0';
        if ((bVar10) || (pcVar9[lVar8 + 1] != "<?"[lVar8 + 1])) break;
        lVar3 = lVar8 + 1;
      } while ((int)lVar8 == 0);
      bVar11 = (int)lVar8 == 1;
      pcVar7 = "<?" + lVar8 + 1;
    }
    else {
      bVar11 = false;
      bVar10 = false;
    }
    if ((bVar11) || ((bVar10 && (*pcVar7 == '\0')))) goto LAB_001bb38d;
    pcVar7 = "<!--";
    if (pcVar9 == "<!--") {
LAB_001bb43f:
      pXVar5 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
      pXVar5->_document = this;
      pXVar5->_parent = (XMLNode *)0x0;
      (pXVar5->_value)._flags = 0;
      (pXVar5->_value)._start = (char *)0x0;
      (pXVar5->_value)._end = (char *)0x0;
      pXVar5->_firstChild = (XMLNode *)0x0;
      pXVar5->_lastChild = (XMLNode *)0x0;
      pXVar5->_prev = (XMLNode *)0x0;
      pXVar5->_next = (XMLNode *)0x0;
      pXVar5->_vptr_XMLNode = (_func_int **)&PTR_ToElement_002725e0;
      pXVar5->_memPool = &(this->_commentPool).super_MemPool;
      pcVar9 = pcVar9 + 4;
      goto LAB_001bb3d3;
    }
    if (cVar2 == '<') {
      lVar3 = 0;
      do {
        lVar8 = lVar3;
        bVar10 = pcVar9[lVar8 + 1] == '\0';
        if ((bVar10) || (pcVar9[lVar8 + 1] != "<!--"[lVar8 + 1])) break;
        lVar3 = lVar8 + 1;
      } while ((uint)lVar8 < 3);
      bVar11 = (uint)lVar8 == 3;
      pcVar7 = "<!--" + lVar8 + 1;
    }
    else {
      bVar11 = false;
      bVar10 = false;
    }
    if ((bVar11) || ((bVar10 && (*pcVar7 == '\0')))) goto LAB_001bb43f;
    pcVar7 = "<![CDATA[";
    if (pcVar9 == "<![CDATA[") {
LAB_001bb4e1:
      pXVar5 = (XMLNode *)MemPoolT<96>::Alloc(&this->_textPool);
      pXVar5->_document = this;
      pXVar5->_parent = (XMLNode *)0x0;
      (pXVar5->_value)._flags = 0;
      (pXVar5->_value)._start = (char *)0x0;
      (pXVar5->_value)._end = (char *)0x0;
      pXVar5->_firstChild = (XMLNode *)0x0;
      pXVar5->_lastChild = (XMLNode *)0x0;
      pXVar5->_prev = (XMLNode *)0x0;
      pXVar5->_next = (XMLNode *)0x0;
      pXVar5->_vptr_XMLNode = (_func_int **)&PTR_ToElement_00272978;
      pXVar5->_memPool = &(this->_textPool).super_MemPool;
      pcVar9 = pcVar9 + 9;
      *(undefined1 *)&pXVar5[1]._vptr_XMLNode = 1;
      goto LAB_001bb3d3;
    }
    if (cVar2 == '<') {
      lVar3 = 0;
      do {
        lVar8 = lVar3;
        bVar10 = pcVar9[lVar8 + 1] == '\0';
        if ((bVar10) || (pcVar9[lVar8 + 1] != "<![CDATA["[lVar8 + 1])) break;
        lVar3 = lVar8 + 1;
      } while ((uint)lVar8 < 8);
      bVar11 = (uint)lVar8 == 8;
      pcVar7 = "<![CDATA[" + lVar8 + 1;
    }
    else {
      bVar11 = false;
      bVar10 = false;
    }
    if ((bVar11) || ((bVar10 && (*pcVar7 == '\0')))) goto LAB_001bb4e1;
    pcVar7 = "<!";
    if (pcVar9 != "<!") {
      if (cVar2 == '<') {
        lVar3 = 0;
        do {
          lVar8 = lVar3;
          bVar10 = pcVar9[lVar8 + 1] == '\0';
          if ((bVar10) || (pcVar9[lVar8 + 1] != "<!"[lVar8 + 1])) break;
          lVar3 = lVar8 + 1;
        } while ((int)lVar8 == 0);
        bVar11 = (int)lVar8 == 1;
        pcVar7 = "<!" + lVar8 + 1;
      }
      else {
        bVar11 = false;
        bVar10 = false;
      }
      if ((!bVar11) && ((!bVar10 || (*pcVar7 != '\0')))) {
        if ((pcVar9 == "<") || (cVar2 == '<')) {
          pXVar5 = (XMLNode *)MemPoolT<104>::Alloc(&this->_elementPool);
          pXVar5->_document = this;
          pXVar5->_parent = (XMLNode *)0x0;
          (pXVar5->_value)._flags = 0;
          (pXVar5->_value)._start = (char *)0x0;
          (pXVar5->_value)._end = (char *)0x0;
          pXVar5->_firstChild = (XMLNode *)0x0;
          pXVar5->_lastChild = (XMLNode *)0x0;
          pXVar5->_prev = (XMLNode *)0x0;
          pXVar5->_next = (XMLNode *)0x0;
          pXVar5->_vptr_XMLNode = (_func_int **)&PTR_ToElement_002727c0;
          *(undefined4 *)&pXVar5[1]._vptr_XMLNode = 0;
          pXVar5[1]._document = (XMLDocument *)0x0;
          pXVar5->_memPool = &(this->_elementPool).super_MemPool;
          pcVar9 = pcVar9 + 1;
        }
        else {
          pXVar5 = (XMLNode *)MemPoolT<96>::Alloc(&this->_textPool);
          pXVar5->_document = this;
          pXVar5->_parent = (XMLNode *)0x0;
          (pXVar5->_value)._flags = 0;
          (pXVar5->_value)._start = (char *)0x0;
          (pXVar5->_value)._end = (char *)0x0;
          pXVar5->_firstChild = (XMLNode *)0x0;
          pXVar5->_lastChild = (XMLNode *)0x0;
          pXVar5->_prev = (XMLNode *)0x0;
          pXVar5->_next = (XMLNode *)0x0;
          pXVar5->_vptr_XMLNode = (_func_int **)&PTR_ToElement_00272978;
          *(undefined1 *)&pXVar5[1]._vptr_XMLNode = 0;
          pXVar5->_memPool = &(this->_textPool).super_MemPool;
          pcVar9 = p;
        }
        goto LAB_001bb3d3;
      }
    }
    pXVar5 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
    pXVar5->_document = this;
    pXVar5->_parent = (XMLNode *)0x0;
    (pXVar5->_value)._flags = 0;
    (pXVar5->_value)._start = (char *)0x0;
    (pXVar5->_value)._end = (char *)0x0;
    pXVar5->_firstChild = (XMLNode *)0x0;
    pXVar5->_lastChild = (XMLNode *)0x0;
    pXVar5->_prev = (XMLNode *)0x0;
    pXVar5->_next = (XMLNode *)0x0;
    ppuVar6 = &PTR_ToElement_00272720;
  }
  pXVar5->_vptr_XMLNode = (_func_int **)ppuVar6;
  pXVar5->_memPool = &(this->_commentPool).super_MemPool;
  pcVar9 = pcVar9 + 2;
LAB_001bb3d3:
  *node = pXVar5;
  return pcVar9;
}

Assistant:

char* XMLDocument::Identify( char* p, XMLNode** node )
{
    TIXMLASSERT( node );
    TIXMLASSERT( p );
    char* const start = p;
    p = XMLUtil::SkipWhiteSpace( p );
    if( !*p ) {
        *node = 0;
        TIXMLASSERT( p );
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader		= { "<?" };
    static const char* commentHeader	= { "<!--" };
    static const char* cdataHeader		= { "<![CDATA[" };
    static const char* dtdHeader		= { "<!" };
    static const char* elementHeader	= { "<" };	// and a header for everything else; check last.

    static const int xmlHeaderLen		= 2;
    static const int commentHeaderLen	= 4;
    static const int cdataHeaderLen		= 9;
    static const int dtdHeaderLen		= 2;
    static const int elementHeaderLen	= 1;

    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLUnknown ) );		// use same memory pool
    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLDeclaration ) );	// use same memory pool
    XMLNode* returnNode = 0;
    if ( XMLUtil::StringEqual( p, xmlHeader, xmlHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLDeclaration ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLDeclaration( this );
        returnNode->_memPool = &_commentPool;
        p += xmlHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, commentHeader, commentHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLComment ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLComment( this );
        returnNode->_memPool = &_commentPool;
        p += commentHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, cdataHeader, cdataHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        XMLText* text = new (_textPool.Alloc()) XMLText( this );
        returnNode = text;
        returnNode->_memPool = &_textPool;
        p += cdataHeaderLen;
        text->SetCData( true );
    }
    else if ( XMLUtil::StringEqual( p, dtdHeader, dtdHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLUnknown ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLUnknown( this );
        returnNode->_memPool = &_commentPool;
        p += dtdHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, elementHeader, elementHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
        returnNode = new (_elementPool.Alloc()) XMLElement( this );
        returnNode->_memPool = &_elementPool;
        p += elementHeaderLen;
    }
    else {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        returnNode = new (_textPool.Alloc()) XMLText( this );
        returnNode->_memPool = &_textPool;
        p = start;	// Back it up, all the text counts.
    }

    TIXMLASSERT( returnNode );
    TIXMLASSERT( p );
    *node = returnNode;
    return p;
}